

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O2

int32 store_reg_mat(char *regmatfn,uint32 *veclen,uint32 n_class,uint32 n_stream,float32 ****A,
                   float32 ***B)

{
  int32 iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  __stream = fopen(regmatfn,"w");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmllr/mllr_io.c"
            ,0x37,"Unable to open %s to store MLLR matrices\n",regmatfn);
    iVar1 = -1;
  }
  else {
    fprintf(__stream,"%d\n",(ulong)n_class);
    fprintf(__stream,"%d\n",(ulong)n_stream);
    for (uVar6 = 0; uVar6 != n_class; uVar6 = uVar6 + 1) {
      for (uVar3 = 0; uVar3 != n_stream; uVar3 = uVar3 + 1) {
        fprintf(__stream,"%d\n",(ulong)veclen[uVar3]);
        uVar5 = 0;
        while( true ) {
          uVar2 = (ulong)veclen[uVar3];
          uVar7 = 0;
          if (uVar2 <= uVar5) break;
          for (; uVar7 < uVar2; uVar7 = uVar7 + 1) {
            fprintf(__stream,"%f ",(double)(float)A[uVar6][uVar3][uVar5][uVar7]);
            uVar2 = (ulong)veclen[uVar3];
          }
          fputc(10,__stream);
          uVar5 = uVar5 + 1;
        }
        for (; uVar7 < uVar2; uVar7 = uVar7 + 1) {
          fprintf(__stream,"%f ",(double)(float)B[uVar6][uVar3][uVar7]);
          uVar2 = (ulong)veclen[uVar3];
        }
        fputc(10,__stream);
        for (uVar4 = 0; uVar4 < veclen[uVar3]; uVar4 = uVar4 + 1) {
          fwrite("1.0 ",4,1,__stream);
        }
        fputc(10,__stream);
      }
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int32
store_reg_mat (const char    *regmatfn,
	       const uint32  *veclen,
	       uint32  n_class,
	       uint32  n_stream,
	       float32 ****A,
	       float32 ***B)
{
    uint32 i,j,k,m;
    FILE  *fp;

    if ((fp = fopen(regmatfn,"w")) == NULL) {
	E_INFO("Unable to open %s to store MLLR matrices\n",regmatfn);
	return S3_ERROR;
    }

    fprintf(fp,"%d\n",n_class);
    fprintf(fp,"%d\n",n_stream); 
    for (m = 0; m < n_class; m++) {
	for (i = 0; i < n_stream; i++) {
	    fprintf(fp,"%d\n", veclen[i]); 
	    for (j = 0; j < veclen[i]; j++) {
		for (k = 0; k < veclen[i]; ++k) {
		    fprintf(fp,"%f ",A[m][i][j][k]);
		}
		fprintf(fp,"\n");
	    }
	    for (j = 0; j < veclen[i]; j++) {
		fprintf(fp,"%f ",B[m][i][j]);
	    }
	    fprintf(fp,"\n");
	    /* Identity transform for variances. */
	    for (j = 0; j < veclen[i]; j++) {
		fprintf(fp,"1.0 ");
	    }
	    fprintf(fp,"\n");
	}
    }
    fclose(fp);
    return S3_SUCCESS;
}